

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O3

void __thiscall
t_markdown_generator::print_const_value
          (t_markdown_generator *this,t_type *type,t_const_value *tvalue)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 uVar3;
  t_program *ptVar4;
  pointer pcVar5;
  pointer __n;
  undefined1 *puVar6;
  string *psVar7;
  t_markdown_generator *this_00;
  t_const_value_type tVar8;
  int iVar9;
  ostream *poVar10;
  long *plVar11;
  _func_int **pp_Var12;
  undefined4 extraout_var;
  undefined8 *puVar13;
  undefined8 uVar14;
  _Base_ptr p_Var15;
  int64_t iVar16;
  _Rb_tree_node_base *p_Var17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var_00;
  long *plVar18;
  ulong *puVar19;
  size_type *psVar20;
  ulong uVar21;
  long lVar22;
  t_type *ptVar23;
  char *pcVar24;
  ofstream_with_content_based_conditional_update *poVar25;
  undefined1 auVar26 [8];
  _Rb_tree_header *p_Var27;
  t_type *type_00;
  bool bVar28;
  string fname;
  string name;
  undefined1 local_1a0 [8];
  undefined1 local_198 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [2];
  string local_170;
  string local_150;
  t_markdown_generator *local_130;
  ofstream_with_content_based_conditional_update *local_128;
  uint local_11c;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  _Rb_tree_node_base *local_d8;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  tVar8 = t_const_value::get_type(tvalue);
  if (tVar8 == CV_IDENTIFIER) {
    ptVar4 = (this->super_t_generator).program_;
    pcVar5 = (ptVar4->name_)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar5,pcVar5 + (ptVar4->name_)._M_string_length);
    make_file_name((string *)local_1a0,this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    paVar2 = &local_150.field_2;
    pcVar5 = (tvalue->identifierVal_)._M_dataplus._M_p;
    local_150._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar5,pcVar5 + (tvalue->identifierVal_)._M_string_length);
    escape_html(&local_170,this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,"[```",4);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&this->f_out_,local_170._M_dataplus._M_p,
                         local_170._M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_1a0,(_func_int *)((long)local_198 + (long)local_1a0));
    make_file_link(&local_70,this,&local_90);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x391aec);
    plVar18 = plVar11 + 2;
    if ((long *)*plVar11 == plVar18) {
      local_a0 = *plVar18;
      lStack_98 = plVar11[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar18;
      local_b0 = (long *)*plVar11;
    }
    local_a8 = plVar11[1];
    *plVar11 = (long)plVar18;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar24 = "#constant-";
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar19 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar19) {
      local_e8 = *puVar19;
      lStack_e0 = plVar11[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar19;
      local_f8 = (ulong *)*plVar11;
    }
    local_f0 = plVar11[1];
    *plVar11 = (long)puVar19;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    str_to_id(&local_d0,(t_markdown_generator *)pcVar24,&local_170);
    uVar21 = 0xf;
    if (local_f8 != &local_e8) {
      uVar21 = local_e8;
    }
    if (uVar21 < local_d0._M_string_length + local_f0) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar14 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_d0._M_string_length + local_f0) goto LAB_0024175a;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_0024175a:
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d0._M_dataplus._M_p);
    }
    local_118 = &local_108;
    puVar1 = puVar13 + 2;
    if ((undefined8 *)*puVar13 == puVar1) {
      local_108 = *puVar1;
      uStack_100 = puVar13[3];
    }
    else {
      local_108 = *puVar1;
      local_118 = (undefined8 *)*puVar13;
    }
    local_110 = puVar13[1];
    *puVar13 = puVar1;
    puVar13[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar20 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_150.field_2._M_allocated_capacity = *psVar20;
      local_150.field_2._8_8_ = plVar11[3];
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar20;
      local_150._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_150._M_string_length = plVar11[1];
    *plVar11 = (long)psVar20;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,local_150._M_dataplus._M_p,local_150._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    psVar7 = &local_170;
LAB_00241acc:
    puVar6 = (undefined1 *)(&(psVar7->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6 != &psVar7->field_2) {
      operator_delete(puVar6);
    }
    if (local_1a0 == (undefined1  [8])(local_198 + 8)) {
      return;
    }
LAB_00241aec:
    operator_delete((void *)local_1a0);
    return;
  }
  pp_Var12 = (type->super_t_doc)._vptr_t_doc;
  while (iVar9 = (*pp_Var12[9])(type), (char)iVar9 != '\0') {
    type = t_typedef::get_type((t_typedef *)type);
    pp_Var12 = (((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc;
  }
  iVar9 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[5])(type);
  if ((char)iVar9 == '\0') {
    iVar9 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[10])(type);
    if ((char)iVar9 == '\0') {
      iVar9 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xb])(type);
      local_130 = this;
      if (((char)iVar9 == '\0') &&
         (iVar9 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xc])(type),
         (char)iVar9 == '\0')) {
        iVar9 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0x10])(type);
        if ((char)iVar9 != '\0') {
          poVar25 = &this->f_out_;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"{ ",2);
          std::
          _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
          ::_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      *)local_1a0,
                     (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      *)tvalue);
          p_Var17 = (_Rb_tree_node_base *)CONCAT44(local_190[0]._12_4_,local_190[0]._8_4_);
          if (p_Var17 != (_Rb_tree_node_base *)local_198) {
            bVar28 = true;
            do {
              if (!bVar28) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", ",2);
              }
              print_const_value(local_130,*(t_type **)&((t_typedef *)type)->forward_,
                                *(t_const_value **)(p_Var17 + 1));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," = ",3);
              print_const_value(local_130,
                                (t_type *)
                                (((t_typedef *)((long)type + 0xb8))->super_t_type).super_t_doc.
                                _vptr_t_doc,(t_const_value *)p_Var17[1]._M_parent);
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
              bVar28 = false;
            } while (p_Var17 != (_Rb_tree_node_base *)local_198);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," }",2);
          std::
          _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
          ::~_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                       *)local_1a0);
          return;
        }
        iVar9 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xe])(type);
        if ((char)iVar9 == '\0') {
          iVar9 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xf])(type);
          poVar25 = &this->f_out_;
          if ((char)iVar9 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar25,"UNKNOWN TYPE",0xc);
            return;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"{ ",2);
          std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
                    ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)local_1a0,
                     &tvalue->listVal_);
          if (local_1a0 != local_198) {
            bVar28 = true;
            auVar26 = local_1a0;
            do {
              if (!bVar28) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", ",2);
              }
              print_const_value(this,*(t_type **)&((t_typedef *)type)->forward_,
                                *(t_const_value **)auVar26);
              auVar26 = (undefined1  [8])((long)auVar26 + 8);
              bVar28 = false;
            } while (auVar26 != local_198);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," }",2);
        }
        else {
          poVar25 = &this->f_out_;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"{ ",2);
          std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
                    ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)local_1a0,
                     &tvalue->listVal_);
          if (local_1a0 != local_198) {
            bVar28 = true;
            auVar26 = local_1a0;
            do {
              if (!bVar28) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", ",2);
              }
              print_const_value(this,*(t_type **)&((t_typedef *)type)->forward_,
                                *(t_const_value **)auVar26);
              auVar26 = (undefined1  [8])((long)auVar26 + 8);
              bVar28 = false;
            } while (auVar26 != local_198);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," }",2);
        }
        if (local_1a0 == (undefined1  [8])0x0) {
          return;
        }
        goto LAB_00241aec;
      }
      local_128 = &this->f_out_;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_128,"{ ",2);
      p_Var15 = (tvalue->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var27 = &(tvalue->mapVal_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var15 != p_Var27) {
        uVar14 = CONCAT71((int7)((ulong)poVar10 >> 8),1);
        local_d8 = &p_Var27->_M_header;
        do {
          local_11c = (uint)uVar14;
          ptVar23 = ((t_typedef *)type)->type_;
          if (ptVar23 == (t_type *)(((t_typedef *)type)->symbolic_)._M_dataplus._M_p) {
LAB_00241e35:
            __return_storage_ptr__ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
            iVar9 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
            std::operator+(&local_170,"type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar9));
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_170);
            local_1a0 = (undefined1  [8])*plVar11;
            psVar20 = (size_type *)(plVar11 + 2);
            if (local_1a0 == (undefined1  [8])psVar20) {
              local_190[0]._0_8_ = *psVar20;
              local_190[0]._8_4_ = (undefined4)plVar11[3];
              local_190[0]._12_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
              local_1a0 = (undefined1  [8])(local_198 + 8);
            }
            else {
              local_190[0]._0_8_ = *psVar20;
            }
            local_198 = (undefined1  [8])plVar11[1];
            *plVar11 = (long)psVar20;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            lVar22 = *(long *)(*(long *)(p_Var15 + 1) + 0x48);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,lVar22,*(long *)(*(long *)(p_Var15 + 1) + 0x50) + lVar22
                      );
            std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,&local_150);
            __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                        std::__cxx11::string::~string);
          }
          type_00 = (t_type *)0x0;
          do {
            pp_Var12 = (ptVar23->super_t_doc)._vptr_t_doc;
            local_1a0 = (undefined1  [8])(local_198 + 8);
            lVar22 = *(long *)(*(long *)(p_Var15 + 1) + 0x48);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1a0,lVar22,*(long *)(*(long *)(p_Var15 + 1) + 0x50) + lVar22)
            ;
            auVar26 = local_1a0;
            __n = (pointer)pp_Var12[0xe];
            if ((undefined1  [8])__n == local_198) {
              if (__n == (pointer)0x0) {
                bVar28 = true;
              }
              else {
                iVar9 = bcmp(pp_Var12[0xd],(void *)local_1a0,(size_t)__n);
                bVar28 = iVar9 == 0;
              }
            }
            else {
              bVar28 = false;
            }
            if (auVar26 != (undefined1  [8])(local_198 + 8)) {
              operator_delete((void *)auVar26);
            }
            if (bVar28) {
              type_00 = (t_type *)(ptVar23->super_t_doc)._vptr_t_doc[0xc];
            }
            ptVar23 = (t_type *)&(ptVar23->super_t_doc).doc_;
          } while (ptVar23 != (t_type *)(((t_typedef *)type)->symbolic_)._M_dataplus._M_p);
          if (type_00 == (t_type *)0x0) goto LAB_00241e35;
          if ((local_11c & 1) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_128,", ",2);
          }
          lVar22 = *(long *)(*(long *)(p_Var15 + 1) + 0x48);
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,lVar22,*(long *)(*(long *)(p_Var15 + 1) + 0x50) + lVar22);
          this_00 = local_130;
          escape_html((string *)local_1a0,local_130,&local_170);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_128,(char *)local_1a0,(long)local_198);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
          if (local_1a0 != (undefined1  [8])(local_198 + 8)) {
            operator_delete((void *)local_1a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          print_const_value(this_00,type_00,(t_const_value *)p_Var15[1]._M_parent);
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          uVar14 = 0;
        } while (p_Var15 != local_d8);
      }
      pcVar24 = " }";
      lVar22 = 2;
      poVar25 = local_128;
      goto LAB_00241caa;
    }
    iVar9 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
    escape_html((string *)local_1a0,this,(string *)CONCAT44(extraout_var,iVar9));
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&this->f_out_,(char *)local_1a0,(long)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
    t_const_value::get_identifier_name_abi_cxx11_(&local_150,tvalue);
    escape_html(&local_170,this,&local_150);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,local_170._M_dataplus._M_p,local_170._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    psVar7 = &local_150;
    goto LAB_00241acc;
  }
  uVar3 = *(undefined4 *)&((t_typedef *)type)->type_;
  poVar25 = &this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"```",3);
  switch(uVar3) {
  case 1:
    t_generator::get_escaped_string_abi_cxx11_(&local_170,&this->super_t_generator,tvalue);
    escape_html((string *)local_1a0,this,&local_170);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar25,(char *)local_1a0,(long)local_198);
    if (local_1a0 != (undefined1  [8])(local_198 + 8)) {
      operator_delete((void *)local_1a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    break;
  case 2:
    iVar16 = t_const_value::get_integer(tvalue);
    pcVar24 = "true";
    if (iVar16 == 0) {
      pcVar24 = "false";
    }
    uVar21 = (ulong)(iVar16 == 0) | 4;
    goto LAB_00241b8e;
  case 3:
  case 4:
  case 5:
  case 6:
switchD_002415a3_caseD_3:
    t_const_value::get_integer(tvalue);
    std::ostream::_M_insert<long>((long)poVar25);
    break;
  case 7:
    tVar8 = t_const_value::get_type(tvalue);
    if (tVar8 == CV_INTEGER) goto switchD_002415a3_caseD_3;
    std::ostream::_M_insert<double>(tvalue->doubleVal_);
    break;
  default:
    pcVar24 = "UNKNOWN BASE TYPE";
    uVar21 = 0x11;
LAB_00241b8e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,pcVar24,uVar21);
  }
  pcVar24 = "```";
  lVar22 = 3;
LAB_00241caa:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,pcVar24,lVar22);
  return;
}

Assistant:

void t_markdown_generator::print_const_value(t_type* type, t_const_value* tvalue) {

  // if tvalue is an identifier, the constant content is already shown elsewhere
  if (tvalue->get_type() == t_const_value::CV_IDENTIFIER) {
    string fname = make_file_name(program_->get_name());
    string name = escape_html(tvalue->get_identifier());
    f_out_ << "[```" << name << "```](" 
      + make_file_link(fname) 
      + "#constant-" + str_to_id(name) + ")";
    return;
  }

  t_type* truetype = type;
  while (truetype->is_typedef()) {
    truetype = ((t_typedef*)truetype)->get_type();
  }

  bool first = true;
  if (truetype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)truetype)->get_base();
    f_out_ << "```";
    switch (tbase) {
    case t_base_type::TYPE_STRING: 
      f_out_ << escape_html(get_escaped_string(tvalue));
      break;
    case t_base_type::TYPE_BOOL:
      f_out_ << ((tvalue->get_integer() != 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I16:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I32:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I64:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (tvalue->get_type() == t_const_value::CV_INTEGER) {
        f_out_ << tvalue->get_integer();
      } else {
        f_out_ << tvalue->get_double();
      }
      break;
    default:
      f_out_ << "UNKNOWN BASE TYPE";
      break;
    }
    f_out_ << "```";
  } else if (truetype->is_enum()) {
    f_out_ << escape_html(truetype->get_name()) << "."
           << escape_html(tvalue->get_identifier_name());
  } else if (truetype->is_struct() || truetype->is_xception()) {
    f_out_ << "{ ";
    const vector<t_field*>& fields = ((t_struct*)truetype)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = tvalue->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + truetype->get_name() + " has no field "
            + v_iter->first->get_string();
      }
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      f_out_ << escape_html(v_iter->first->get_string()) << " = ";
      print_const_value(field_type, v_iter->second);
    }
    f_out_ << " }";
  } else if (truetype->is_map()) {
    f_out_ << "{ ";
    map<t_const_value*, t_const_value*, t_const_value::value_compare> map_elems = tvalue->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator map_iter;
    for (map_iter = map_elems.begin(); map_iter != map_elems.end(); map_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_map*)truetype)->get_key_type(), map_iter->first);
      f_out_ << " = ";
      print_const_value(((t_map*)truetype)->get_val_type(), map_iter->second);
    }
    f_out_ << " }";
  } else if (truetype->is_list()) {
    f_out_ << "{ ";
    vector<t_const_value*> list_elems = tvalue->get_list();
    ;
    vector<t_const_value*>::iterator list_iter;
    for (list_iter = list_elems.begin(); list_iter != list_elems.end(); list_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_list*)truetype)->get_elem_type(), *list_iter);
    }
    f_out_ << " }";
  } else if (truetype->is_set()) {
    f_out_ << "{ ";
    vector<t_const_value*> list_elems = tvalue->get_list();
    ;
    vector<t_const_value*>::iterator list_iter;
    for (list_iter = list_elems.begin(); list_iter != list_elems.end(); list_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_set*)truetype)->get_elem_type(), *list_iter);
    }
    f_out_ << " }";
  } else {
    f_out_ << "UNKNOWN TYPE";
  }
}